

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_mb_type(bitstream *str,h264_cabac_context *cabac,uint32_t slice_type,uint32_t *val)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  h264_macroblock *phVar4;
  bool local_94;
  bool local_93;
  bool local_92;
  bool local_91;
  bool local_90;
  bool local_8f;
  bool local_8e;
  bool local_8d;
  int condTermFlagB;
  int condTermFlagA;
  uint32_t mbtB;
  uint32_t mbtA;
  int bidx [11];
  int rend;
  int rstart;
  uint32_t rval;
  uint32_t *val_local;
  h264_cabac_context *phStack_20;
  uint32_t slice_type_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  _rstart = val;
  val_local._4_4_ = slice_type;
  phStack_20 = cabac;
  cabac_local = (h264_cabac_context *)str;
  if (cabac == (h264_cabac_context *)0x0) {
    switch(slice_type) {
    case 0:
    case 3:
      bidx[10] = 0x1b;
      bidx[9] = 0x20;
      break;
    case 1:
      bidx[10] = 0x21;
      bidx[9] = 0x38;
      break;
    case 2:
      bidx[10] = 0;
      bidx[9] = 0;
      break;
    case 4:
      bidx[10] = 0x1a;
      bidx[9] = 0x1b;
      break;
    default:
      abort();
    }
    if (str->dir == VS_ENCODE) {
      if ((*val < (uint)bidx[10]) || ((uint)bidx[9] <= *val)) {
        if (0x19 < *val) {
          fprintf(_stderr,"Invalid mb_type for this slice_type\n");
          return 1;
        }
        rend = (*val + bidx[9]) - bidx[10];
      }
      else {
        rend = *val - bidx[10];
      }
    }
    iVar3 = vs_ue(str,(uint32_t *)&rend);
    if (iVar3 != 0) {
      return 1;
    }
    if (*(int *)&cabac_local->slice == 1) {
      if ((uint)rend < (uint)(bidx[9] - bidx[10])) {
        *_rstart = rend + bidx[10];
      }
      else {
        if ((bidx[9] - bidx[10]) + 0x1aU <= (uint)rend) {
          fprintf(_stderr,"Invalid mb_type for this slice_type\n");
          return 1;
        }
        *_rstart = rend - (bidx[9] - bidx[10]);
      }
    }
  }
  else {
    phVar4 = h264_mb_nb(cabac->slice,H264_MB_A,0);
    uVar1 = phVar4->mb_type;
    phVar4 = h264_mb_nb(phStack_20->slice,H264_MB_B,0);
    uVar2 = phVar4->mb_type;
    local_8d = uVar1 != 0x39;
    local_8e = uVar2 != 0x39;
    switch(val_local._4_4_) {
    case 0:
    case 3:
      bidx[5] = 0xe;
      bidx[6] = 0xf;
      bidx[7] = 0x10;
      bidx[8] = 0x11;
      mbtB = 0x11;
      mbtA = 0x114;
      bidx[0] = 0x12;
      bidx[1] = 0x13;
      bidx[2] = 0x13;
      bidx[3] = 0x14;
      bidx[4] = 0x14;
      h264_cabac_se((bitstream *)cabac_local,phStack_20,mb_type_p,(int *)&mbtB,_rstart);
      break;
    case 1:
      local_93 = false;
      if ((local_8d) && (local_93 = false, uVar1 != 0x38)) {
        local_93 = uVar1 != 0x21;
      }
      local_94 = false;
      if ((local_8e) && (local_94 = false, uVar2 != 0x38)) {
        local_94 = uVar2 != 0x21;
      }
      bidx[5] = local_93 + 0x1b + (uint)local_94;
      bidx[6] = 0x1e;
      bidx[7] = 0x1f;
      bidx[8] = 0x20;
      mbtB = 0x20;
      mbtA = 0x114;
      bidx[0] = 0x21;
      bidx[1] = 0x22;
      bidx[2] = 0x22;
      bidx[3] = 0x23;
      bidx[4] = 0x23;
      h264_cabac_se((bitstream *)cabac_local,phStack_20,mb_type_b,(int *)&mbtB,_rstart);
      break;
    case 2:
      local_91 = local_8d && uVar1 != 0;
      local_92 = local_8e && uVar2 != 0;
      mbtB = local_91 + 3 + (uint)local_92;
      mbtA = 0x114;
      bidx[0] = 6;
      bidx[1] = 7;
      bidx[2] = 8;
      bidx[3] = 9;
      bidx[4] = 10;
      h264_cabac_se((bitstream *)cabac_local,phStack_20,mb_type_i,(int *)&mbtB,_rstart);
      break;
    case 4:
      local_8d = local_8d && uVar1 != 0x1a;
      local_8e = local_8e && uVar2 != 0x1a;
      bidx[5] = (uint)local_8d + (uint)local_8e;
      local_8f = local_8d != 0 && uVar1 != 0;
      local_90 = local_8e != 0 && uVar2 != 0;
      mbtB = local_8f + 3 + (uint)local_90;
      mbtA = 0x114;
      bidx[0] = 6;
      bidx[1] = 7;
      bidx[2] = 8;
      bidx[3] = 9;
      bidx[4] = 10;
      h264_cabac_se((bitstream *)cabac_local,phStack_20,mb_type_si,(int *)&mbtB,_rstart);
    }
  }
  return 0;
}

Assistant:

int h264_mb_type(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t slice_type, uint32_t *val) {
	if (!cabac) {
		uint32_t rval;
		int rstart;
		int rend;
		switch (slice_type) {
			case H264_SLICE_TYPE_I:
				rstart = 0;
				rend = 0;
				break;
			case H264_SLICE_TYPE_SI:
				rstart = H264_MB_TYPE_SI_BASE;
				rend = H264_MB_TYPE_SI_END;
				break;
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				rstart = H264_MB_TYPE_P_BASE;
				rend = H264_MB_TYPE_P_SKIP;
				break;
			case H264_SLICE_TYPE_B:
				rstart = H264_MB_TYPE_B_BASE;
				rend = H264_MB_TYPE_B_SKIP;
				break;
			default:
				abort();
		}
		if (str->dir == VS_ENCODE) {
			if (*val >= rstart && *val < rend) {
				rval = *val - rstart;
			} else if (*val < H264_MB_TYPE_I_END) {
				rval = *val + rend - rstart;
			} else {
				fprintf (stderr, "Invalid mb_type for this slice_type\n");
				return 1;
			}
		}
		if (vs_ue(str, &rval))
			return 1;
		if (str->dir == VS_DECODE) {
			if (rval < rend - rstart) {
				*val = rval + rstart;
			} else if (rval < rend - rstart + H264_MB_TYPE_I_END) {
				*val = rval - (rend - rstart);
			} else {
				fprintf (stderr, "Invalid mb_type for this slice_type\n");
				return 1;
			}
		}
	} else {
		int bidx[11];
		uint32_t mbtA = h264_mb_nb(cabac->slice, H264_MB_A, 0)->mb_type;
		uint32_t mbtB = h264_mb_nb(cabac->slice, H264_MB_B, 0)->mb_type;
		int condTermFlagA = mbtA != H264_MB_TYPE_UNAVAIL;
		int condTermFlagB = mbtB != H264_MB_TYPE_UNAVAIL;
		switch (slice_type) {
			case H264_SLICE_TYPE_SI:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_SI;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_SI;
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_SI_PRE + condTermFlagA + condTermFlagB;
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_I_NXN;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_I_NXN;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_I + condTermFlagA + condTermFlagB;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_I + 3;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_I + 4;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_I + 5;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_I + 6;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_I + 7;
				h264_cabac_se(str, cabac, mb_type_si, bidx, val);
				break;
			case H264_SLICE_TYPE_I:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_I_NXN;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_I_NXN;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_I + condTermFlagA + condTermFlagB;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_I + 3;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_I + 4;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_I + 5;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_I + 6;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_I + 7;
				h264_cabac_se(str, cabac, mb_type_i, bidx, val);
				break;
			case H264_SLICE_TYPE_P:
			case H264_SLICE_TYPE_SP:
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 0;
				bidx[8] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 1;
				bidx[9] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 2;
				bidx[10] = H264_CABAC_CTXIDX_MB_TYPE_P_PRE + 3;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 0;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 1;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 2;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 2;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 3;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_P_SUF + 3;
				h264_cabac_se(str, cabac, mb_type_p, bidx, val);
				break;
			case H264_SLICE_TYPE_B:
				condTermFlagA = condTermFlagA && mbtA != H264_MB_TYPE_B_SKIP && mbtA != H264_MB_TYPE_B_DIRECT_16X16;
				condTermFlagB = condTermFlagB && mbtB != H264_MB_TYPE_B_SKIP && mbtB != H264_MB_TYPE_B_DIRECT_16X16;
				bidx[7] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + condTermFlagA + condTermFlagB;
				bidx[8] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 3;
				bidx[9] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 4;
				bidx[10] = H264_CABAC_CTXIDX_MB_TYPE_B_PRE + 5;
				bidx[0] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 0;
				bidx[1] = H264_CABAC_CTXIDX_TERMINATE;
				bidx[2] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 1;
				bidx[3] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 2;
				bidx[4] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 2;
				bidx[5] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 3;
				bidx[6] = H264_CABAC_CTXIDX_MB_TYPE_B_SUF + 3;
				h264_cabac_se(str, cabac, mb_type_b, bidx, val);
				break;
		}
	}
	return 0;
}